

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdWiden<wabt::interp::Simd<int,(unsigned_char)4>,wabt::interp::Simd<short,(unsigned_char)8>,false>
          (Thread *this)

{
  undefined1 auVar1 [12];
  ulong uVar2;
  undefined1 auVar3 [16];
  Simd<short,_(unsigned_char)__b_> SVar6;
  Simd<int,_(unsigned_char)__x04_> value;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  SVar6 = Pop<wabt::interp::Simd<short,(unsigned_char)8>>(this);
  uVar2 = SVar6.v._8_8_;
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar2;
  auVar5._12_2_ = SVar6.v[7];
  auVar5._14_2_ = SVar6.v[7];
  auVar4._12_4_ = auVar5._12_4_;
  auVar4._8_2_ = 0;
  auVar4._0_8_ = uVar2;
  auVar4._10_2_ = SVar6.v[6];
  auVar3._10_6_ = auVar4._10_6_;
  auVar3._8_2_ = SVar6.v[6];
  auVar3._0_8_ = uVar2;
  auVar1._4_8_ = auVar3._8_8_;
  auVar1._2_2_ = SVar6.v[5];
  auVar1._0_2_ = SVar6.v[5];
  value.v[1] = auVar1._0_4_ >> 0x10;
  value.v[0] = (int)SVar6.v[4];
  value.v[3] = auVar4._12_4_ >> 0x10;
  value.v[2] = auVar3._8_4_ >> 0x10;
  Push<wabt::interp::Simd<int,(unsigned_char)4>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdWiden() {
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = val[(low ? 0 : S::lanes) + i];
  }
  Push(result);
  return RunResult::Ok;
}